

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

int __thiscall cmCTestScriptHandler::ExtractVariables(cmCTestScriptHandler *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  string *psVar3;
  ulong uVar4;
  char *pcVar5;
  double dVar6;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  string local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  allocator<char> local_3b1;
  undefined1 local_3b0 [8];
  string msg;
  string local_388;
  allocator<char> local_361;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  allocator<char> local_319;
  string local_318;
  char *local_2f8;
  char *updateVal;
  char local_2e8 [4];
  int i;
  char updateVar [40];
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *contDuration;
  char *minInterval;
  cmCTestScriptHandler *this_local;
  
  pcVar1 = this->Makefile;
  minInterval = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CTEST_SOURCE_DIRECTORY",&local_49);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_48);
  std::__cxx11::string::operator=((string *)&this->SourceDir,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CTEST_BINARY_DIRECTORY",&local_81);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_80);
  std::__cxx11::string::operator=((string *)&this->BinaryDir,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  cmsys::SystemTools::AddKeepPath(&this->SourceDir);
  cmsys::SystemTools::AddKeepPath(&this->BinaryDir);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"CTEST_COMMAND",&local_a9);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_a8);
  std::__cxx11::string::operator=((string *)&this->CTestCmd,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"CTEST_CVS_CHECKOUT",&local_d1);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_d0);
  std::__cxx11::string::operator=((string *)&this->CVSCheckOut,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"CTEST_DASHBOARD_ROOT",&local_f9);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_f8);
  std::__cxx11::string::operator=((string *)&this->CTestRoot,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"CTEST_UPDATE_COMMAND",&local_121);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_120);
  std::__cxx11::string::operator=((string *)&this->UpdateCmd,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"CTEST_CVS_COMMAND",&local_149);
    psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_148);
    std::__cxx11::string::operator=((string *)&this->UpdateCmd,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"CTEST_ENVIRONMENT",&local_171);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_170);
  std::__cxx11::string::operator=((string *)&this->CTestEnv,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"CTEST_INITIAL_CACHE",&local_199);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_198);
  std::__cxx11::string::operator=((string *)&this->InitialCache,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"CTEST_CMAKE_COMMAND",&local_1c1);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_1c0);
  std::__cxx11::string::operator=((string *)&this->CMakeCmd,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"CTEST_CMAKE_OUTPUT_FILE_NAME",&local_1e9);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_1e8);
  std::__cxx11::string::operator=((string *)&this->CMOutFile,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"CTEST_BACKUP_AND_RESTORE",&local_211);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_210);
  this->Backup = bVar2;
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"CTEST_START_WITH_EMPTY_BINARY_DIRECTORY",&local_239);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_238);
  this->EmptyBinDir = bVar2;
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"CTEST_START_WITH_EMPTY_BINARY_DIRECTORY_ONCE",&local_261);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_260);
  this->EmptyBinDirOnce = bVar2;
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"CTEST_CONTINUOUS_MINIMUM_INTERVAL",&local_289);
  contDuration = cmMakefile::GetDefinition(pcVar1,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"CTEST_CONTINUOUS_DURATION",&local_2b1);
  local_28 = cmMakefile::GetDefinition(pcVar1,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  updateVal._4_4_ = 1;
  do {
    if (9 < (int)updateVal._4_4_) {
      if (((this->Backup & 1U) == 0) || (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
        uVar4 = std::__cxx11::string::empty();
        if (((uVar4 & 1) == 0) &&
           ((uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0 &&
            (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)))) {
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) != 0) {
            cmsys::SystemTools::GetFilenamePath(&local_3f8,&this->SourceDir);
            std::__cxx11::string::operator=((string *)&this->CTestRoot,(string *)&local_3f8);
            std::__cxx11::string::~string((string *)&local_3f8);
          }
          if (contDuration != (char *)0x0) {
            dVar6 = atof(contDuration);
            this->MinimumInterval = dVar6 * 60.0;
          }
          if (local_28 != (char *)0x0) {
            dVar6 = atof(local_28);
            this->ContinuousDuration = dVar6 * 60.0;
          }
          UpdateElapsedTime(this);
          this_local._4_4_ = 0;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_3b0,"CTEST_SOURCE_DIRECTORY = ",&local_3b1);
          std::allocator<char>::~allocator(&local_3b1);
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            local_5c0 = (char *)std::__cxx11::string::c_str();
          }
          else {
            local_5c0 = "(Null)";
          }
          std::__cxx11::string::operator+=((string *)local_3b0,local_5c0);
          std::__cxx11::string::operator+=((string *)local_3b0,"\nCTEST_BINARY_DIRECTORY = ");
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            local_5c8 = (char *)std::__cxx11::string::c_str();
          }
          else {
            local_5c8 = "(Null)";
          }
          std::__cxx11::string::operator+=((string *)local_3b0,local_5c8);
          std::__cxx11::string::operator+=((string *)local_3b0,"\nCTEST_COMMAND = ");
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            local_5d0 = (char *)std::__cxx11::string::c_str();
          }
          else {
            local_5d0 = "(Null)";
          }
          std::__cxx11::string::operator+=((string *)local_3b0,local_5d0);
          std::operator+(&local_3d8,
                         "Some required settings in the configuration file were missing:\n",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3b0);
          cmSystemTools::Error(&local_3d8);
          std::__cxx11::string::~string((string *)&local_3d8);
          this_local._4_4_ = 4;
          std::__cxx11::string::~string((string *)local_3b0);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_388,
                   "Backup was requested without specifying CTEST_CVS_CHECKOUT.",
                   (allocator<char> *)(msg.field_2._M_local_buf + 0xf));
        cmSystemTools::Error(&local_388);
        std::__cxx11::string::~string((string *)&local_388);
        std::allocator<char>::~allocator((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
        this_local._4_4_ = 3;
      }
      return this_local._4_4_;
    }
    sprintf(local_2e8,"CTEST_EXTRA_UPDATES_%i",(ulong)updateVal._4_4_);
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,local_2e8,&local_319);
    pcVar5 = cmMakefile::GetDefinition(pcVar1,&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator(&local_319);
    local_2f8 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_360,local_2e8,&local_361);
        std::operator+(&local_340,&local_360," specified without specifying CTEST_CVS_COMMAND.");
        cmSystemTools::Error(&local_340);
        std::__cxx11::string::~string((string *)&local_340);
        std::__cxx11::string::~string((string *)&local_360);
        std::allocator<char>::~allocator(&local_361);
        return 0xc;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->ExtraUpdates,&local_2f8);
    }
    updateVal._4_4_ = updateVal._4_4_ + 1;
  } while( true );
}

Assistant:

int cmCTestScriptHandler::ExtractVariables()
{
  // Temporary variables
  const char* minInterval;
  const char* contDuration;

  this->SourceDir =
    this->Makefile->GetSafeDefinition("CTEST_SOURCE_DIRECTORY");
  this->BinaryDir =
    this->Makefile->GetSafeDefinition("CTEST_BINARY_DIRECTORY");

  // add in translations for src and bin
  cmSystemTools::AddKeepPath(this->SourceDir);
  cmSystemTools::AddKeepPath(this->BinaryDir);

  this->CTestCmd = this->Makefile->GetSafeDefinition("CTEST_COMMAND");
  this->CVSCheckOut = this->Makefile->GetSafeDefinition("CTEST_CVS_CHECKOUT");
  this->CTestRoot = this->Makefile->GetSafeDefinition("CTEST_DASHBOARD_ROOT");
  this->UpdateCmd = this->Makefile->GetSafeDefinition("CTEST_UPDATE_COMMAND");
  if (this->UpdateCmd.empty()) {
    this->UpdateCmd = this->Makefile->GetSafeDefinition("CTEST_CVS_COMMAND");
  }
  this->CTestEnv = this->Makefile->GetSafeDefinition("CTEST_ENVIRONMENT");
  this->InitialCache =
    this->Makefile->GetSafeDefinition("CTEST_INITIAL_CACHE");
  this->CMakeCmd = this->Makefile->GetSafeDefinition("CTEST_CMAKE_COMMAND");
  this->CMOutFile =
    this->Makefile->GetSafeDefinition("CTEST_CMAKE_OUTPUT_FILE_NAME");

  this->Backup = this->Makefile->IsOn("CTEST_BACKUP_AND_RESTORE");
  this->EmptyBinDir =
    this->Makefile->IsOn("CTEST_START_WITH_EMPTY_BINARY_DIRECTORY");
  this->EmptyBinDirOnce =
    this->Makefile->IsOn("CTEST_START_WITH_EMPTY_BINARY_DIRECTORY_ONCE");

  minInterval =
    this->Makefile->GetDefinition("CTEST_CONTINUOUS_MINIMUM_INTERVAL");
  contDuration = this->Makefile->GetDefinition("CTEST_CONTINUOUS_DURATION");

  char updateVar[40];
  int i;
  for (i = 1; i < 10; ++i) {
    sprintf(updateVar, "CTEST_EXTRA_UPDATES_%i", i);
    const char* updateVal = this->Makefile->GetDefinition(updateVar);
    if (updateVal) {
      if (this->UpdateCmd.empty()) {
        cmSystemTools::Error(
          std::string(updateVar) +
          " specified without specifying CTEST_CVS_COMMAND.");
        return 12;
      }
      this->ExtraUpdates.emplace_back(updateVal);
    }
  }

  // in order to backup and restore we also must have the cvs root
  if (this->Backup && this->CVSCheckOut.empty()) {
    cmSystemTools::Error(
      "Backup was requested without specifying CTEST_CVS_CHECKOUT.");
    return 3;
  }

  // make sure the required info is here
  if (this->SourceDir.empty() || this->BinaryDir.empty() ||
      this->CTestCmd.empty()) {
    std::string msg = "CTEST_SOURCE_DIRECTORY = ";
    msg += (!this->SourceDir.empty()) ? this->SourceDir.c_str() : "(Null)";
    msg += "\nCTEST_BINARY_DIRECTORY = ";
    msg += (!this->BinaryDir.empty()) ? this->BinaryDir.c_str() : "(Null)";
    msg += "\nCTEST_COMMAND = ";
    msg += (!this->CTestCmd.empty()) ? this->CTestCmd.c_str() : "(Null)";
    cmSystemTools::Error(
      "Some required settings in the configuration file were missing:\n" +
      msg);
    return 4;
  }

  // if the dashboard root isn't specified then we can compute it from the
  // this->SourceDir
  if (this->CTestRoot.empty()) {
    this->CTestRoot = cmSystemTools::GetFilenamePath(this->SourceDir);
  }

  // the script may override the minimum continuous interval
  if (minInterval) {
    this->MinimumInterval = 60 * atof(minInterval);
  }
  if (contDuration) {
    this->ContinuousDuration = 60.0 * atof(contDuration);
  }

  this->UpdateElapsedTime();

  return 0;
}